

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O0

void classdef_free(classdef_t *classdef)

{
  int local_14;
  int32 i;
  classdef_t *classdef_local;
  
  for (local_14 = 0; local_14 < classdef->n_words; local_14 = local_14 + 1) {
    ckd_free(classdef->words[local_14]);
  }
  ckd_free(classdef->words);
  ckd_free(classdef->weights);
  ckd_free(classdef);
  return;
}

Assistant:

void
classdef_free(classdef_t * classdef)
{
    int32 i;
    for (i = 0; i < classdef->n_words; ++i)
        ckd_free(classdef->words[i]);
    ckd_free(classdef->words);
    ckd_free(classdef->weights);
    ckd_free(classdef);
}